

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O3

bool __thiscall gjkepa2_impl::EPA::expand(EPA *this,U pass,sSV *w,sFace *f,U e,sHorizon *horizon)

{
  uint uVar1;
  uint uVar2;
  sFace *psVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  sFace *psVar6;
  U *pUVar7;
  
  if (f->pass == pass) {
    return false;
  }
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)((f->n).m_floats[1] * (w->w).m_floats[1])),
                           ZEXT416((uint)(f->n).m_floats[0]),ZEXT416((uint)(w->w).m_floats[0]));
  uVar1 = expand::i1m3[e];
  auVar4 = vfmadd132ss_fma(ZEXT416((uint)(f->n).m_floats[2]),auVar4,
                           ZEXT416((uint)(w->w).m_floats[2]));
  if (auVar4._0_4_ - f->d < -1e-05) {
    psVar6 = newface(this,f->c[uVar1],f->c[e],w,false);
    if (psVar6 == (sFace *)0x0) {
      return false;
    }
    psVar6->e[0] = (U1)e;
    psVar6->f[0] = f;
    f->e[e] = '\0';
    f->f[e] = psVar6;
    psVar3 = horizon->cf;
    if (psVar3 == (sFace *)0x0) {
      horizon->ff = psVar6;
    }
    else {
      psVar3->e[1] = '\x02';
      psVar3->f[1] = psVar6;
      psVar6->e[2] = '\x01';
      psVar6->f[2] = psVar3;
    }
    horizon->cf = psVar6;
    pUVar7 = &horizon->nf;
  }
  else {
    uVar2 = expand::i2m3[e];
    f->pass = (U1)pass;
    bVar5 = expand(this,pass,w,f->f[uVar1],(uint)f->e[uVar1],horizon);
    if (!bVar5) {
      return false;
    }
    bVar5 = expand(this,pass,w,f->f[uVar2],(uint)f->e[uVar2],horizon);
    if (!bVar5) {
      return false;
    }
    psVar6 = f->l[0];
    if (f->l[1] != (sFace *)0x0) {
      f->l[1]->l[0] = psVar6;
    }
    if (psVar6 != (sFace *)0x0) {
      psVar6->l[1] = f->l[1];
    }
    if ((this->m_hull).root == f) {
      (this->m_hull).root = f->l[1];
    }
    pUVar7 = &(this->m_hull).count;
    *pUVar7 = *pUVar7 - 1;
    f->l[0] = (sFace *)0x0;
    psVar6 = (this->m_stock).root;
    f->l[1] = psVar6;
    if (psVar6 != (sFace *)0x0) {
      psVar6->l[0] = f;
    }
    (this->m_stock).root = f;
    pUVar7 = &(this->m_stock).count;
  }
  *pUVar7 = *pUVar7 + 1;
  return true;
}

Assistant:

bool expand(U pass, sSV* w, sFace* f, U e, sHorizon& horizon)
	{
		static const U i1m3[] = {1, 2, 0};
		static const U i2m3[] = {2, 0, 1};
		if (f->pass != pass)
		{
			const U e1 = i1m3[e];
			if ((cbtDot(f->n, w->w) - f->d) < -EPA_PLANE_EPS)
			{
				sFace* nf = newface(f->c[e1], f->c[e], w, false);
				if (nf)
				{
					bind(nf, 0, f, e);
					if (horizon.cf)
						bind(horizon.cf, 1, nf, 2);
					else
						horizon.ff = nf;
					horizon.cf = nf;
					++horizon.nf;
					return (true);
				}
			}
			else
			{
				const U e2 = i2m3[e];
				f->pass = (U1)pass;
				if (expand(pass, w, f->f[e1], f->e[e1], horizon) &&
					expand(pass, w, f->f[e2], f->e[e2], horizon))
				{
					remove(m_hull, f);
					append(m_stock, f);
					return (true);
				}
			}
		}
		return (false);
	}